

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-chatd.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  ulong uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  long lVar7;
  int *piVar8;
  telnet_t *ptVar9;
  ssize_t sVar10;
  uint *puVar11;
  undefined8 extraout_RAX;
  ulong uVar12;
  long lVar13;
  long extraout_RDX;
  undefined8 *overflow;
  undefined8 *extraout_RDX_00;
  undefined8 *ud;
  ulong uVar14;
  int *piVar15;
  uint uVar16;
  user_t *puVar17;
  bool bVar18;
  int rs;
  socklen_t addrlen;
  sockaddr_in addr;
  pollfd pfd [65];
  char buffer [512];
  uint local_460;
  socklen_t local_45c;
  sockaddr local_458;
  pollfd local_448 [64];
  int local_248;
  undefined2 local_244;
  byte local_242;
  int local_238 [130];
  
  if (argc == 2) {
    memset(local_448,0,0x208);
    memset(users,0,0x4800);
    lVar7 = 8;
    do {
      pcVar1 = users[0].linebuf + lVar7 + -0x18;
      pcVar1[0] = -1;
      pcVar1[1] = -1;
      pcVar1[2] = -1;
      pcVar1[3] = -1;
      lVar7 = lVar7 + 0x120;
    } while (lVar7 != 0x4808);
    lVar7 = strtol(argv[1],(char **)0x0,10);
    iVar5 = socket(2,1,0);
    if (iVar5 == -1) {
      main_cold_7();
    }
    else {
      local_460 = 1;
      setsockopt(iVar5,1,2,&local_460,4);
      local_458.sa_data[6] = '\0';
      local_458.sa_data[7] = '\0';
      local_458.sa_data[8] = '\0';
      local_458.sa_data[9] = '\0';
      local_458.sa_data[10] = '\0';
      local_458.sa_data[0xb] = '\0';
      local_458.sa_data[0xc] = '\0';
      local_458.sa_data[0xd] = '\0';
      uVar4 = (ushort)lVar7;
      local_458.sa_data._0_2_ = uVar4 << 8 | uVar4 >> 8;
      local_458.sa_family = 2;
      local_458.sa_data._2_4_ = 0;
      iVar6 = bind(iVar5,&local_458,0x10);
      if (iVar6 == -1) {
        main_cold_6();
      }
      else {
        iVar6 = listen(iVar5,5);
        if (iVar6 != -1) {
          printf("LISTENING ON PORT %d\n",(ulong)(uint)(int)(short)uVar4);
          local_244 = 1;
          local_248 = iVar5;
          do {
            lVar7 = 0;
            do {
              iVar6 = users[lVar7].sock;
              local_448[lVar7].fd = iVar6;
              local_448[lVar7].events = (ushort)(iVar6 != -1);
              lVar7 = lVar7 + 1;
            } while (lVar7 != 0x40);
            local_460 = poll(local_448,0x41,-1);
            if ((local_460 == 0xffffffff) && (piVar8 = __errno_location(), *piVar8 != 4)) {
              main_cold_2();
              return 1;
            }
            if ((local_242 & 0x19) != 0) {
              local_45c = 0x10;
              iVar6 = accept(iVar5,&local_458,&local_45c);
              if (iVar6 == -1) {
                main_cold_3();
                return 1;
              }
              puts("Connection received.");
              piVar8 = &users[0].sock;
              lVar7 = 0;
              do {
                if (*piVar8 == -1) goto LAB_001016c7;
                lVar7 = lVar7 + 1;
                piVar8 = piVar8 + 0x48;
              } while (lVar7 != 0x40);
              puts("  rejected (too many users)");
              _send(iVar6,"Too many users.\r\n",0xe);
              close(iVar6);
              lVar7 = 0x40;
LAB_001016c7:
              users[lVar7].sock = iVar6;
              ptVar9 = telnet_init(telopts,_event_handler,'\0',users + lVar7);
              users[lVar7].telnet = ptVar9;
              telnet_negotiate(ptVar9,0xfb,'V');
              telnet_printf(users[lVar7].telnet,"Enter name: ");
              telnet_negotiate(users[lVar7].telnet,0xfb,'\x01');
            }
            puVar17 = users;
            lVar7 = 0;
            do {
              if ((puVar17->sock != -1) && ((local_448[lVar7].revents & 0x19) != 0)) {
                piVar8 = local_238;
                sVar10 = recv(puVar17->sock,local_238,0x200,0);
                local_460 = (uint)sVar10;
                if ((int)local_460 < 1) {
                  if (local_460 == 0) {
                    puts("Connection closed.");
                    close(puVar17->sock);
                    puVar17->sock = -1;
                    if (puVar17->name != (char *)0x0) {
                      _message(puVar17->name,"** HAS DISCONNECTED **");
                      free(puVar17->name);
                      puVar17->name = (char *)0x0;
                    }
                    telnet_free(puVar17->telnet);
                  }
                  else {
                    puVar11 = (uint *)__errno_location();
                    uVar16 = *puVar11;
                    if (uVar16 != 4) {
                      main_cold_4();
                      puVar11 = (uint *)CONCAT71((int7)((ulong)extraout_RAX >> 8),
                                                 uVar16 == 0xffffffff);
                      lVar7 = extraout_RDX;
                      if (extraout_RDX == 0 || uVar16 == 0xffffffff) goto LAB_00101850;
                      goto LAB_0010181b;
                    }
                  }
                }
                else {
                  telnet_recv(puVar17->telnet,(char *)local_238,(ulong)(local_460 & 0x7fffffff));
                }
              }
              lVar7 = lVar7 + 1;
              puVar17 = puVar17 + 1;
            } while (lVar7 != 0x40);
          } while( true );
        }
        main_cold_5();
      }
    }
  }
  else {
    main_cold_1();
  }
  return 1;
LAB_0010192a:
  cVar2 = *(char *)(lVar7 + uVar12);
  if (cVar2 == '\0') {
    if (((long)*(int *)(overflow + 0x23) < 1) ||
       (*(char *)((long)overflow + (long)*(int *)(overflow + 0x23) + 0x17) != '\r'))
    goto LAB_0010196a;
  }
  else {
    if ((cVar2 == '\n') &&
       ((lVar13 = (long)*(int *)(overflow + 0x23), 0 < lVar13 &&
        (*(char *)((long)overflow + lVar13 + 0x17) == '\r')))) {
      *(undefined1 *)((long)overflow + lVar13 + 0x17) = 0;
    }
    else {
LAB_0010196a:
      iVar5 = *(int *)(overflow + 0x23);
      if ((long)iVar5 != 0x100) {
        ud = (undefined8 *)(ulong)(iVar5 + 1U);
        *(uint *)(overflow + 0x23) = iVar5 + 1U;
        *(char *)((long)overflow + (long)iVar5 + 0x18) = cVar2;
        goto LAB_001019a5;
      }
      *(undefined1 *)((long)overflow + 0x117) = 0;
    }
    _online((char *)(overflow + 3),(size_t)overflow,ud);
    *(undefined4 *)(overflow + 0x23) = 0;
    ud = extraout_RDX_00;
  }
LAB_001019a5:
  if ((*(int *)(overflow + 1) == -1) ||
     (bVar18 = uVar3 == uVar14, uVar12 = uVar14, uVar14 = (ulong)((int)uVar14 + 1), bVar18)) {
LAB_001019b8:
    telnet_negotiate(ptVar9,0xfc,'\x01');
    telnet_negotiate(ptVar9,0xfb,'\x01');
    return extraout_EAX_01;
  }
  goto LAB_0010192a;
  while( true ) {
    if (iVar5 == 0) {
      _send_cold_1();
      goto LAB_0010185a;
    }
    puVar11 = (uint *)(long)iVar5;
    piVar8 = (int *)((long)piVar8 + (long)puVar11);
    lVar7 = lVar7 - (long)puVar11;
    if (lVar7 == 0) break;
LAB_0010181b:
    ptVar9 = (telnet_t *)(ulong)uVar16;
    piVar15 = piVar8;
    sVar10 = send(uVar16,piVar8,(long)(int)lVar7,0);
    iVar5 = (int)sVar10;
    if (iVar5 == -1) {
      puVar11 = (uint *)__errno_location();
      uVar16 = *puVar11;
      ptVar9 = (telnet_t *)(ulong)uVar16;
      if ((uVar16 != 4) && (uVar16 != 0x68)) {
LAB_0010185a:
        _send_cold_2();
        iVar5 = *piVar15;
        if (iVar5 < 5) {
          if (iVar5 == 0) {
            uVar3 = *(ulong *)(piVar15 + 4);
            if ((uVar3 == 0) || (*(int *)(overflow + 1) == -1)) goto LAB_001019b8;
            lVar7 = *(long *)(piVar15 + 2);
            uVar12 = 0;
            ud = overflow;
            uVar14 = 1;
            goto LAB_0010192a;
          }
          if (iVar5 == 1) {
            _send(*(int *)(overflow + 1),*(char **)(piVar15 + 2),*(size_t *)(piVar15 + 4));
            return extraout_EAX;
          }
        }
        else if (iVar5 == 5) {
          if ((char)piVar15[1] == 'V') {
            telnet_begin_compress2(ptVar9);
            return extraout_EAX_02;
          }
        }
        else if (iVar5 == 0xe) {
          close(*(int *)(overflow + 1));
          *(undefined4 *)(overflow + 1) = 0xffffffff;
          if ((char *)*overflow != (char *)0x0) {
            _message((char *)*overflow,"** HAS HAD AN ERROR **");
            free((void *)*overflow);
            *overflow = 0;
          }
          telnet_free((telnet_t *)overflow[2]);
          return extraout_EAX_00;
        }
        return iVar5;
      }
      break;
    }
  }
LAB_00101850:
  return (int)puVar11;
}

Assistant:

int main(int argc, char **argv) {
	char buffer[512];
	short listen_port;
	SOCKET listen_sock;
	SOCKET client_sock;
	int rs;
	int i;
	struct sockaddr_in addr;
	socklen_t addrlen;
	struct pollfd pfd[MAX_USERS + 1];

	/* initialize Winsock */
#if defined(_WIN32)
	WSADATA wsd;
	WSAStartup(MAKEWORD(2, 2), &wsd);
#endif

	/* check usage */
	if (argc != 2) {
		fprintf(stderr, "Usage:\n ./telnet-chatd <port>\n");
		return 1;
	}

	/* initialize data structures */
	memset(&pfd, 0, sizeof(pfd));
	memset(users, 0, sizeof(users));
	for (i = 0; i != MAX_USERS; ++i)
		users[i].sock = -1;

	/* parse listening port */
	listen_port = (short)strtol(argv[1], 0, 10);

	/* create listening socket */
	if ((listen_sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
		fprintf(stderr, "socket() failed: %s\n", strerror(errno));
		return 1;
	}

	/* reuse address option */
	rs = 1;
	setsockopt(listen_sock, SOL_SOCKET, SO_REUSEADDR, (char*)&rs, sizeof(rs));

	/* bind to listening addr/port */
	memset(&addr, 0, sizeof(addr));
	addr.sin_family = AF_INET;
	addr.sin_addr.s_addr = INADDR_ANY;
	addr.sin_port = htons(listen_port);
	if (bind(listen_sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
		fprintf(stderr, "bind() failed: %s\n", strerror(errno));
		close(listen_sock);
		return 1;
	}

	/* listen for clients */
	if (listen(listen_sock, 5) == -1) {
		fprintf(stderr, "listen() failed: %s\n", strerror(errno));
		close(listen_sock);
		return 1;
	}

	printf("LISTENING ON PORT %d\n", listen_port);

	/* initialize listening descriptors */
	pfd[MAX_USERS].fd = listen_sock;
	pfd[MAX_USERS].events = POLLIN;

	/* loop for ever */
	for (;;) {
		/* prepare for poll */
		for (i = 0; i != MAX_USERS; ++i) {
			if (users[i].sock != -1) {
				pfd[i].fd = users[i].sock;
				pfd[i].events = POLLIN;
			} else {
				pfd[i].fd = -1;
				pfd[i].events = 0;
			}
		}

		/* poll */
		rs = poll(pfd, MAX_USERS + 1, -1);
		if (rs == -1 && errno != EINTR) {
			fprintf(stderr, "poll() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}

		/* new connection */
		if (pfd[MAX_USERS].revents & (POLLIN | POLLERR | POLLHUP)) {
			/* acept the sock */
			addrlen = sizeof(addr);
			if ((client_sock = accept(listen_sock, (struct sockaddr *)&addr,
					&addrlen)) == -1) {
				fprintf(stderr, "accept() failed: %s\n", strerror(errno));
				return 1;
			}

			printf("Connection received.\n");

			/* find a free user */
			for (i = 0; i != MAX_USERS; ++i)
				if (users[i].sock == -1)
					break;
			if (i == MAX_USERS) {
				printf("  rejected (too many users)\n");
				_send(client_sock, "Too many users.\r\n", 14);
				close(client_sock);
			}

			/* init, welcome */
			users[i].sock = client_sock;
			users[i].telnet = telnet_init(telopts, _event_handler, 0,
					&users[i]);
			telnet_negotiate(users[i].telnet, TELNET_WILL,
					TELNET_TELOPT_COMPRESS2);
			telnet_printf(users[i].telnet, "Enter name: ");

			telnet_negotiate(users[i].telnet, TELNET_WILL, TELNET_TELOPT_ECHO);
		}

		/* read from client */
		for (i = 0; i != MAX_USERS; ++i) {
			/* skip users that aren't actually connected */
			if (users[i].sock == -1)
				continue;

			if (pfd[i].revents & (POLLIN | POLLERR | POLLHUP)) {
				if ((rs = recv(users[i].sock, buffer, sizeof(buffer), 0)) > 0) {
					telnet_recv(users[i].telnet, buffer, rs);
				} else if (rs == 0) {
					printf("Connection closed.\n");
					close(users[i].sock);
					users[i].sock = -1;
					if (users[i].name != 0) {
						_message(users[i].name, "** HAS DISCONNECTED **");
						free(users[i].name);
						users[i].name = 0;
					}
					telnet_free(users[i].telnet);
				} else if (errno != EINTR) {
					fprintf(stderr, "recv(client) failed: %s\n",
							strerror(errno));
					exit(1);
				}
			}
		}
	}

	/* not that we can reach this, but GCC will cry if it's not here */
	return 0;
}